

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::operator()(CppGenerator *this)

{
  Grammar **this_00;
  QList<int> *this_01;
  QList<int> *this_02;
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
  *pQVar4;
  _Base_ptr p_Var5;
  Recognizer *pRVar6;
  FILE *pFVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  int *table;
  int *table_00;
  const_iterator cVar11;
  int *piVar12;
  _Rb_tree_node_base *p_Var13;
  const_iterator cVar14;
  _Base_ptr p_Var15;
  QTextStream *pQVar16;
  char *pcVar17;
  Automaton *pAVar18;
  pointer piVar19;
  pointer piVar20;
  long *plVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  StatePointer state;
  _List_node_base *p_Var25;
  char16_t *pcVar26;
  int iVar27;
  _Base_ptr *pp_Var28;
  _Link_type p_Var29;
  Grammar *pGVar30;
  size_t sVar31;
  char *pcVar32;
  QFile *this_03;
  long lVar33;
  _List_node_base *p_Var34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  char16_t *pcVar38;
  int iVar39;
  long lVar40;
  long in_FS_OFFSET;
  R RVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  NameSet lookaheads;
  int local_194;
  QString local_158;
  undefined1 *local_138;
  undefined1 *puStack_130;
  QString local_128;
  undefined1 *local_108;
  undefined1 *puStack_100;
  QString local_f8;
  QString local_d8;
  QString local_b8;
  undefined1 local_98 [8];
  char *pcStack_90;
  _Link_type local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  size_t local_70;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar18 = this->aut;
  iVar37 = (int)(pAVar18->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
                _M_size;
  this->state_count = iVar37;
  this_00 = &this->grammar;
  iVar23 = (int)(this->grammar->terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->terminal_count = iVar23;
  iVar39 = (int)(this->grammar->non_terminals)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this->non_terminal_count = iVar39;
  iVar23 = iVar23 * iVar37;
  sVar1 = (long)iVar23 * 4;
  sVar31 = sVar1;
  if (iVar23 < 0) {
    sVar31 = 0xffffffffffffffff;
  }
  table = (int *)operator_new__(sVar31);
  local_194 = 0;
  memset(table,0,sVar1);
  iVar39 = iVar39 * iVar37;
  sVar1 = (long)iVar39 * 4;
  uVar36 = 0xffffffffffffffff;
  if (-1 < iVar39) {
    uVar36 = sVar1;
  }
  table_00 = (int *)operator_new__(uVar36);
  memset(table_00,0,sVar1);
  this->accept_state = -1;
  state._M_node =
       (pAVar18->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
       super__List_node_base._M_next;
  iVar37 = 0;
  if (state._M_node != (_List_node_base *)&pAVar18->states) {
    iVar37 = 0;
    local_194 = 0;
    do {
      iVar23 = Automaton::id(pAVar18,state);
      p_Var25 = state._M_node + 4;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var25);
      p_Var13 = (_Rb_tree_node_base *)state._M_node[4]._M_next[2]._M_next;
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var25);
      if (p_Var13 != (_Rb_tree_node_base *)(state._M_node[4]._M_next + 1)) {
        do {
          iVar39 = Automaton::id(this->aut,*(_List_node_base **)(p_Var13 + 1));
          iVar9 = Automaton::id(this->aut,(_List_node_base *)p_Var13[1]._M_parent);
          pGVar30 = this->grammar;
          local_68 = *(undefined1 (*) [8])(p_Var13 + 1);
          cVar11 = std::
                   _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   ::find(&(pGVar30->non_terminals)._M_t,(key_type *)local_68);
          if ((_Rb_tree_header *)cVar11._M_node ==
              &(pGVar30->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
            iVar39 = iVar39 + this->terminal_count * iVar23;
            piVar12 = table;
          }
          else {
            iVar39 = (iVar39 - this->terminal_count) + this->non_terminal_count * iVar23;
            piVar12 = table_00;
          }
          piVar12[iVar39] = iVar9;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::detach
                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)p_Var25);
        } while ((_Rb_tree_header *)p_Var13 !=
                 &(((((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
                       *)&p_Var25->_M_next)->d).ptr)->m)._M_t._M_impl.super__Rb_tree_header);
      }
      for (local_b8.d.d = (Data *)state._M_node[2]._M_prev;
          local_b8.d.d != (Data *)&state._M_node[2]._M_prev; local_b8.d.d = *(Data **)local_b8.d.d)
      {
        if ((_List_node_base *)(&(local_b8.d.d)->super_QArrayData)[1].alloc ==
            (_List_node_base *)
            &(*(_List_node_base **)(&(local_b8.d.d)->super_QArrayData + 1))[1]._M_prev) {
          iVar39 = Automaton::id(this->aut,
                                 *(_List_node_base **)(&(local_b8.d.d)->super_QArrayData + 1));
          _Stack_60._M_right = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._M_parent = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._M_left = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          _Stack_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = (_Link_type)0x0;
          local_98 = (undefined1  [8])0x0;
          pcStack_90 = (char *)0x0;
          local_80 = (_Base_ptr)&pcStack_90;
          local_70 = 0;
          local_78 = local_80;
          QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
          ::value((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   *)local_68,&this->aut->lookaheads,(_List_iterator<Item> *)&local_b8,
                  (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   *)local_98);
          std::
          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::_M_erase((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)local_98,local_88);
          if (*(_List_node_base **)&local_b8.d.d[1].super_QArrayData ==
              (this->grammar->goal)._M_node) {
            this->accept_state = iVar23;
          }
          if (_Stack_60._M_left != &_Stack_60) {
            iVar9 = -iVar39;
            p_Var15 = _Stack_60._M_left;
            do {
              p_Var13 = p_Var15 + 1;
              iVar27 = this->terminal_count;
              iVar10 = Automaton::id(this->aut,*(_List_node_base **)(p_Var15 + 1));
              iVar10 = iVar10 + iVar27 * iVar23;
              iVar27 = table[iVar10];
              if (iVar27 == 0) goto LAB_00106645;
              if (iVar27 < 0) {
                bVar22 = this->verbose;
                if ((bool)bVar22 == true) {
                  pQVar16 = qout();
                  pQVar16 = (QTextStream *)
                            QTextStream::operator<<
                                      (pQVar16,
                                       "*** Warning. Found a reduce/reduce conflict in state ");
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar23);
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," on token ``");
                  pQVar16 = operator<<(pQVar16,(Name *)p_Var13);
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"\'\' between rule ");
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar39);
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," and ");
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,-table[iVar10]);
                  Qt::endl(pQVar16);
                  iVar27 = table[iVar10];
                  bVar22 = this->verbose;
                }
                local_194 = local_194 + 1;
                if (iVar27 == iVar9 || SBORROW4(iVar27,iVar9) != iVar27 + iVar39 < 0) {
                  iVar27 = iVar9;
                }
                table[iVar10] = iVar27;
                if ((bVar22 & 1) != 0) {
                  pQVar16 = qout();
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"\tresolved using rule ")
                  ;
                  iVar27 = -table[iVar10];
LAB_0010660d:
                  pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar27);
                  Qt::endl(pQVar16);
                }
              }
              else {
                pGVar30 = *this_00;
                if ((((list<QString,_std::allocator<QString>_> *)
                      *(undefined1 **)(*(long *)&local_b8.d.d[1].super_QArrayData + 0x30) ==
                      &pGVar30->names) ||
                    (pQVar4 = (pGVar30->token_info).d.d.ptr,
                    pQVar4 == (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                               *)0x0)) ||
                   (cVar14 = std::
                             _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                             ::find(&(pQVar4->m)._M_t,(key_type *)p_Var13),
                   cVar14._M_node ==
                   &(((pGVar30->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                    _M_header)) {
                  iVar37 = iVar37 + 1;
                  if (this->verbose == true) {
                    pQVar16 = qout();
                    pQVar16 = (QTextStream *)
                              QTextStream::operator<<
                                        (pQVar16,
                                         "*** Warning. Found a shift/reduce conflict in state ");
                    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar23);
                    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," on token ``");
                    pQVar16 = operator<<(pQVar16,(Name *)p_Var13);
                    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"\'\' with rule ");
                    iVar27 = iVar39;
                    goto LAB_0010660d;
                  }
                }
                else {
                  pGVar30 = *this_00;
                  local_98 = (undefined1  [8])0x0;
                  pQVar4 = (pGVar30->token_info).d.d.ptr;
                  if (pQVar4 == (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                                 *)0x0) {
LAB_00106625:
                    table[iVar10] = 0;
                  }
                  else {
                    cVar14 = std::
                             _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                             ::find(&(pQVar4->m)._M_t,
                                    (key_type *)(*(long *)&local_b8.d.d[1].super_QArrayData + 0x30))
                    ;
                    pp_Var28 = &cVar14._M_node[1]._M_parent;
                    if (cVar14._M_node ==
                        &(((pGVar30->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                         _M_header) {
                      pp_Var28 = (_Base_ptr *)local_98;
                    }
                    p_Var5 = *pp_Var28;
                    pGVar30 = *this_00;
                    pQVar4 = (pGVar30->token_info).d.d.ptr;
                    local_98 = (undefined1  [8])0x0;
                    if (pQVar4 == (QMapData<std::map<std::_List_iterator<QString>,_Grammar::TokenInfo,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>_>
                                   *)0x0) {
                      iVar27 = 0;
                    }
                    else {
                      cVar14 = std::
                               _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_Grammar::TokenInfo>_>_>
                               ::find(&(pQVar4->m)._M_t,(key_type *)p_Var13);
                      pp_Var28 = &cVar14._M_node[1]._M_parent;
                      if (cVar14._M_node ==
                          &(((pGVar30->token_info).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header.
                           _M_header) {
                        pp_Var28 = (_Base_ptr *)local_98;
                      }
                      iVar27 = *(int *)((long)pp_Var28 + 4);
                    }
                    iVar24 = (int)((ulong)p_Var5 >> 0x20);
                    if (iVar27 < iVar24) {
LAB_00106645:
                      table[iVar10] = iVar9;
                    }
                    else if (iVar24 == iVar27) {
                      iVar27 = (int)p_Var5;
                      if (iVar27 == 0) goto LAB_00106625;
                      if (iVar27 == 1) goto LAB_00106645;
                    }
                  }
                }
              }
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
            } while (p_Var15 != &_Stack_60);
          }
          std::
          _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          ::_M_erase((_Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)local_68,(_Link_type)_Stack_60._M_parent);
        }
      }
      state._M_node = (state._M_node)->_M_next;
      pAVar18 = this->aut;
    } while (state._M_node != (_List_node_base *)&pAVar18->states);
  }
  if (iVar37 != 0 || local_194 != 0) {
    if ((iVar37 != (*this_00)->expected_shift_reduce) ||
       (local_194 != (*this_00)->expected_reduce_reduce)) {
      pQVar16 = qerr();
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"*** Conflicts: ");
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar37);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," shift/reduce, ");
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,local_194);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," reduce/reduce");
      Qt::endl(pQVar16);
      if (this->warnings_are_errors == true) {
LAB_001079de:
        pQVar16 = qerr();
        pQVar16 = (QTextStream *)
                  QTextStream::operator<<
                            (pQVar16,
                             "qlalr: error: warning occurred, treating as error due to --exit-on-warn."
                            );
        Qt::endl(pQVar16);
        exit(2);
      }
    }
    if (this->verbose == true) {
      pQVar16 = qout();
      pQVar16 = (QTextStream *)Qt::endl(pQVar16);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"*** Conflicts: ");
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,iVar37);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," shift/reduce, ");
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,local_194);
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16," reduce/reduce");
      pQVar16 = (QTextStream *)Qt::endl(pQVar16);
      Qt::endl(pQVar16);
    }
  }
  local_88 = (_Link_type)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  pcStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  iVar37 = 0;
  QBitArray::QBitArray
            ((QBitArray *)local_98,
             (long)(int)(this->grammar->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl
                        ._M_node._M_size,false);
  pAVar18 = this->aut;
  p_Var25 = (pAVar18->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var25 != (_List_node_base *)&pAVar18->states) {
    iVar23 = this->terminal_count;
    iVar39 = iVar23;
    do {
      if (0 < iVar39) {
        lVar40 = 0;
        do {
          if (table[iVar39 * iVar37 + lVar40] < 0) {
            RVar41 = QBitArray::bitLocation<QBitArray>
                               ((QBitArray *)local_98,
                                (QBitArray *)(ulong)(uint)~table[iVar39 * iVar37 + lVar40],
                                (qsizetype)table);
            *RVar41.byte = *RVar41.byte | RVar41.bitMask;
            iVar23 = this->terminal_count;
          }
          lVar40 = lVar40 + 1;
          iVar39 = iVar23;
        } while ((int)lVar40 < iVar23);
        pAVar18 = this->aut;
      }
      iVar37 = iVar37 + 1;
      p_Var25 = p_Var25->_M_next;
    } while (p_Var25 != (_List_node_base *)&pAVar18->states);
  }
  pcVar32 = pcStack_90;
  if (pcStack_90 == (char *)0x0) {
    pcVar32 = (char *)&QByteArray::_empty;
  }
  if (0 < (long)local_88 * 8 - (long)*pcVar32) {
    p_Var25 = ((*this_00)->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
              super__List_node_base._M_next;
    uVar36 = 0;
    pcVar32 = pcStack_90;
    p_Var29 = local_88;
    do {
      if ((((byte)pcVar32[(uVar36 >> 3) + 1] >> ((uint)uVar36 & 7) & 1) == 0) &&
         (p_Var25 != ((*this_00)->goal)._M_node)) {
        pQVar16 = qerr();
        pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"*** Warning: Rule ``");
        pQVar16 = operator<<(pQVar16,(Rule *)(p_Var25 + 1));
        pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"\'\' is useless!");
        Qt::endl(pQVar16);
        pcVar32 = pcStack_90;
        p_Var29 = local_88;
        if (this->warnings_are_errors != false) goto LAB_001079de;
      }
      pcVar17 = pcVar32;
      if (pcVar32 == (char *)0x0) {
        pcVar17 = (char *)&QByteArray::_empty;
      }
      uVar36 = uVar36 + 1;
      p_Var25 = p_Var25->_M_next;
    } while ((long)uVar36 < (long)p_Var29 * 8 - (long)*pcVar17);
    pAVar18 = this->aut;
  }
  p_Var25 = (pAVar18->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var25 != (_List_node_base *)&pAVar18->states) {
    uVar2 = this->terminal_count;
    pGVar30 = this->grammar;
    lVar40 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar33 = lVar40 * (ulong)uVar2;
        uVar36 = 0;
        do {
          uVar3 = table[lVar33 + uVar36];
          if ((int)uVar3 < 0) {
            p_Var34 = (pGVar30->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node
                      .super__List_node_base._M_next;
            if (uVar3 != 0xffffffff) {
              uVar35 = (ulong)~uVar3;
              do {
                p_Var34 = p_Var34->_M_next;
                uVar35 = uVar35 - 1;
              } while (uVar35 != 0);
            }
            if (p_Var25[5]._M_prev == p_Var34) {
              table[lVar33 + uVar36] = 0;
            }
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar2);
      }
      lVar40 = lVar40 + 1;
      p_Var25 = p_Var25->_M_next;
    } while (p_Var25 != (_List_node_base *)&pAVar18->states);
  }
  this_01 = &this->defgoto;
  QList<int>::resize(this_01,(long)this->non_terminal_count);
  iVar37 = this->state_count;
  uVar36 = (ulong)(uint)this->non_terminal_count;
  if (0 < this->non_terminal_count) {
    this_02 = &this->count;
    lVar40 = 0;
    do {
      QList<int>::fill(this_02,0,(long)iVar37);
      piVar19 = QList<int>::data(this_01);
      iVar37 = this->state_count;
      if (0 < iVar37) {
        iVar23 = 0;
        do {
          iVar37 = table_00[this->non_terminal_count * iVar23 + (int)lVar40];
          lVar33 = (long)iVar37;
          if (lVar33 != 0) {
            piVar20 = QList<int>::data(this_02);
            piVar20[lVar33] = piVar20[lVar33] + 1;
            piVar20 = QList<int>::data(this_02);
            iVar39 = piVar20[lVar33];
            iVar9 = piVar19[lVar40];
            piVar20 = QList<int>::data(this_02);
            if (piVar20[iVar9] < iVar39) {
              piVar19[lVar40] = iVar37;
            }
          }
          iVar23 = iVar23 + 1;
          iVar37 = this->state_count;
        } while (iVar23 < iVar37);
      }
      lVar40 = lVar40 + 1;
      uVar36 = (ulong)this->non_terminal_count;
    } while (lVar40 < (long)uVar36);
  }
  if (0 < iVar37) {
    iVar23 = 0;
    do {
      if (0 < (int)uVar36) {
        lVar40 = 0;
        do {
          lVar33 = (int)uVar36 * iVar23 + lVar40;
          iVar37 = table_00[lVar33];
          piVar19 = QList<int>::data(this_01);
          if (iVar37 == piVar19[lVar40]) {
            table_00[lVar33] = 0;
          }
          lVar40 = lVar40 + 1;
          uVar36 = (ulong)this->non_terminal_count;
        } while (lVar40 < (long)uVar36);
        iVar37 = this->state_count;
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 < iVar37);
  }
  Compress::operator()(&this->compressed_action,table,iVar37,this->terminal_count);
  Compress::operator()(&this->compressed_goto,table_00,this->state_count,this->non_terminal_count);
  operator_delete__(table);
  operator_delete__(table_00);
  if ((this->grammar->merged_output).d.size != 0) {
    local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_f8,&this->grammar->merged_output);
    cVar8 = QFile::open((QFile *)&local_f8,2);
    if (cVar8 == '\0') {
      operator()((CppGenerator *)this_00);
    }
    else {
      local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_128,(QIODevice *)&local_f8);
      if (this->copyright == true) {
        QVar42.m_data = (storage_type *)0x9d;
        QVar42.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar42);
        local_b8.d.d = (Data *)local_68;
        local_b8.d.ptr = (char16_t *)_Stack_60._0_8_;
        local_b8.d.size = (qsizetype)_Stack_60._M_parent;
        pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_128,&local_b8);
        QVar43.m_data = (storage_type *)0xfa;
        QVar43.m_size = (qsizetype)local_68;
        QString::fromLatin1(QVar43);
        local_d8.d.d = (Data *)local_68;
        local_d8.d.ptr = (char16_t *)_Stack_60._0_8_;
        local_d8.d.size = (qsizetype)_Stack_60._M_parent;
        pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_d8);
        Qt::endl(pQVar16);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QTextStream::operator<<
                ((QTextStream *)&local_128,"// This file was generated by qlalr - DO NOT EDIT!\n");
      startIncludeGuard((QString *)local_68,&(*this_00)->merged_output);
      pQVar16 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      Qt::endl(pQVar16);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      if (this->copyright == true) {
        pQVar16 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)&local_128,"#if defined(ERROR)");
        pQVar16 = (QTextStream *)Qt::endl(pQVar16);
        pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"#  undef ERROR");
        pQVar16 = (QTextStream *)Qt::endl(pQVar16);
        pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"#endif");
        pQVar16 = (QTextStream *)Qt::endl(pQVar16);
        Qt::endl(pQVar16);
      }
      generateDecl(this,(QTextStream *)&local_128);
      generateImpl(this,(QTextStream *)&local_128);
      pRVar6 = this->p;
      local_68 = (undefined1  [8])(pRVar6->_M_decls).d.d;
      _Stack_60._0_8_ = (pRVar6->_M_decls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar6->_M_decls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      pRVar6 = this->p;
      local_68 = (undefined1  [8])(pRVar6->_M_impls).d.d;
      _Stack_60._0_8_ = (pRVar6->_M_impls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar6->_M_impls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      Qt::endl((QTextStream *)&local_128);
      endIncludeGuard((QString *)local_68,&(*this_00)->merged_output);
      pQVar16 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_128,(QString *)local_68);
      Qt::endl(pQVar16);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      QTextStream::~QTextStream((QTextStream *)&local_128);
    }
    QFile::~QFile((QFile *)&local_f8);
    goto LAB_00106ebe;
  }
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_d8);
  _Stack_60._M_parent = (_Base_ptr)local_d8.d.size;
  _Stack_60._0_8_ = local_d8.d.ptr;
  local_68 = (undefined1  [8])local_d8.d.d;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (char16_t *)0x0;
  local_d8.d.size = 0;
  _Stack_60._M_left = (_Base_ptr)0x4;
  _Stack_60._M_right = (_Base_ptr)0x1173e0;
  QStringBuilder<QString,_QLatin1String>::convertTo<QString>
            (&local_b8,(QStringBuilder<QString,_QLatin1String> *)local_68);
  if (local_68 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_f8);
  _Stack_60._M_parent = (_Base_ptr)local_f8.d.size;
  _Stack_60._0_8_ = local_f8.d.ptr;
  local_68 = (undefined1  [8])local_f8.d.d;
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  _Stack_60._M_left = (_Rb_tree_node_base *)0x4;
  _Stack_60._M_right = (_Base_ptr)0x1173e5;
  QStringBuilder<QString,_QLatin1String>::convertTo<QString>
            (&local_d8,(QStringBuilder<QString,_QLatin1String> *)local_68);
  if (local_68 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_108,&local_b8);
  cVar8 = QFile::open((QFile *)&local_108,2);
  pFVar7 = _stderr;
  if (cVar8 == '\0') {
    QString::toLocal8Bit_helper((QChar *)local_68,(longlong)local_b8.d.ptr);
    pcVar38 = (char16_t *)_Stack_60._0_8_;
    if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
      pcVar38 = (char16_t *)&QByteArray::_empty;
    }
    QIODevice::errorString();
    QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
    pcVar26 = local_f8.d.ptr;
    if (local_f8.d.ptr == (char16_t *)0x0) {
      pcVar26 = (char16_t *)&QByteArray::_empty;
    }
    fprintf(pFVar7,"*** cannot create %s: %s\n",pcVar38,pcVar26);
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_68 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68,1,0x10);
      }
    }
    this_03 = (QFile *)&local_108;
LAB_0010771a:
    QFile::~QFile(this_03);
  }
  else {
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_138,(QIODevice *)&local_108);
    local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::toUpper_helper((QString *)local_68);
    plVar21 = (long *)QString::replace((QChar)(char16_t)(QString *)local_68,(QChar)0x2e,0x5f);
    local_f8.d.d = (Data *)*plVar21;
    local_f8.d.ptr = (char16_t *)plVar21[1];
    local_f8.d.size = plVar21[2];
    if ((QArrayData *)local_f8.d.d != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_f8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_f8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_68 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68,2,0x10);
      }
    }
    if (this->copyright == true) {
      QVar44.m_data = (storage_type *)0x9d;
      QVar44.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar44);
      local_128.d.d = (Data *)local_68;
      local_128.d.ptr = (char16_t *)_Stack_60._0_8_;
      local_128.d.size = (qsizetype)_Stack_60._M_parent;
      pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,&local_128);
      QVar45.m_data = (storage_type *)0xfa;
      QVar45.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar45);
      local_158.d.d = (Data *)local_68;
      local_158.d.ptr = (char16_t *)_Stack_60._0_8_;
      local_158.d.size = (qsizetype)_Stack_60._M_parent;
      pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_158);
      Qt::endl(pQVar16);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QTextStream::operator<<
              ((QTextStream *)&local_138,"// This file was generated by qlalr - DO NOT EDIT!\n");
    pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#ifndef ");
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_f8);
    pQVar16 = (QTextStream *)Qt::endl(pQVar16);
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"#define ");
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_f8);
    pQVar16 = (QTextStream *)Qt::endl(pQVar16);
    Qt::endl(pQVar16);
    if (this->copyright == true) {
      pQVar16 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_138,"#include <QtCore/qglobal.h>");
      pQVar16 = (QTextStream *)Qt::endl(pQVar16);
      Qt::endl(pQVar16);
      pQVar16 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_138,"QT_BEGIN_NAMESPACE");
      pQVar16 = (QTextStream *)Qt::endl(pQVar16);
      Qt::endl(pQVar16);
    }
    generateDecl(this,(QTextStream *)&local_138);
    if (this->copyright == true) {
      pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"QT_END_NAMESPACE")
      ;
      Qt::endl(pQVar16);
    }
    pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_138,"#endif // ");
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_f8);
    pQVar16 = (QTextStream *)Qt::endl(pQVar16);
    Qt::endl(pQVar16);
    if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextStream::~QTextStream((QTextStream *)&local_138);
    QFile::~QFile((QFile *)&local_108);
    local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_158,&local_d8);
    cVar8 = QFile::open((QFile *)&local_158,2);
    pcVar38 = local_d8.d.ptr;
    if (cVar8 == '\0') {
LAB_001078ed:
      pFVar7 = _stderr;
      QString::toLocal8Bit_helper((QChar *)local_68,(longlong)pcVar38);
      pcVar38 = (char16_t *)_Stack_60._0_8_;
      if ((char16_t *)_Stack_60._0_8_ == (char16_t *)0x0) {
        pcVar38 = (char16_t *)&QByteArray::_empty;
      }
      QIODevice::errorString();
      QString::toLocal8Bit_helper((QChar *)&local_f8,(longlong)local_128.d.ptr);
      pcVar26 = local_f8.d.ptr;
      if (local_f8.d.ptr == (char16_t *)0x0) {
        pcVar26 = (char16_t *)&QByteArray::_empty;
      }
      fprintf(pFVar7,"*** cannot create %s: %s\n",pcVar38,pcVar26);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,1,0x10);
        }
      }
LAB_00107715:
      this_03 = (QFile *)&local_158;
      goto LAB_0010771a;
    }
    local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_128.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_128,(QIODevice *)&local_158);
    if (this->copyright == true) {
      QVar46.m_data = (storage_type *)0x9d;
      QVar46.m_size = (qsizetype)local_68;
      QString::fromLatin1(QVar46);
      local_f8.d.d = (Data *)local_68;
      local_f8.d.ptr = (char16_t *)_Stack_60._0_8_;
      local_f8.d.size = (qsizetype)_Stack_60._M_parent;
      QTextStream::operator<<((QTextStream *)&local_128,&local_f8);
      if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QTextStream::operator<<
              ((QTextStream *)&local_128,"// This file was generated by qlalr - DO NOT EDIT!\n");
    pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_128,"#include \"");
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,&local_b8);
    pQVar16 = (QTextStream *)QTextStream::operator<<(pQVar16,"\"");
    pQVar16 = (QTextStream *)Qt::endl(pQVar16);
    Qt::endl(pQVar16);
    if (this->copyright == true) {
      pQVar16 = (QTextStream *)
                QTextStream::operator<<((QTextStream *)&local_128,"QT_BEGIN_NAMESPACE");
      pQVar16 = (QTextStream *)Qt::endl(pQVar16);
      Qt::endl(pQVar16);
    }
    generateImpl(this,(QTextStream *)&local_128);
    if (this->copyright == true) {
      pQVar16 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_128,"QT_END_NAMESPACE")
      ;
      Qt::endl(pQVar16);
    }
    QTextStream::~QTextStream((QTextStream *)&local_128);
    QFile::~QFile((QFile *)&local_158);
    pGVar30 = *this_00;
    if ((pGVar30->decl_file_name).d.size != 0) {
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_158,&pGVar30->decl_file_name);
      cVar8 = QFile::open((QFile *)&local_158,2);
      if (cVar8 == '\0') {
        pcVar38 = ((*this_00)->decl_file_name).d.ptr;
        goto LAB_001078ed;
      }
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_158);
      pRVar6 = this->p;
      local_68 = (undefined1  [8])(pRVar6->_M_decls).d.d;
      _Stack_60._0_8_ = (pRVar6->_M_decls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar6->_M_decls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_f8,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      QTextStream::~QTextStream((QTextStream *)&local_f8);
      QFile::~QFile((QFile *)&local_158);
      pGVar30 = *this_00;
    }
    if ((pGVar30->impl_file_name).d.size != 0) {
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QFile::QFile((QFile *)&local_158,&pGVar30->impl_file_name);
      cVar8 = QFile::open((QFile *)&local_158,2);
      if (cVar8 == '\0') {
        pcVar38 = ((*this_00)->impl_file_name).d.ptr;
        goto LAB_001078ed;
      }
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_f8,(QIODevice *)&local_158);
      pRVar6 = this->p;
      local_68 = (undefined1  [8])(pRVar6->_M_impls).d.d;
      _Stack_60._0_8_ = (pRVar6->_M_impls).d.ptr;
      _Stack_60._M_parent = (_Base_ptr)(pRVar6->_M_impls).d.size;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.super___atomic_base<int>.
        _M_i = (((QArrayData *)&((QArrayData *)local_68)->ref_)->ref_)._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QTextStream::operator<<((QTextStream *)&local_f8,(QString *)local_68);
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      QTextStream::~QTextStream((QTextStream *)&local_f8);
      goto LAB_00107715;
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00106ebe:
  if (local_98 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CppGenerator::operator () ()
{
  // action table...
  state_count = static_cast<int>(aut.states.size());
  terminal_count = static_cast<int>(grammar.terminals.size());
  non_terminal_count = static_cast<int>(grammar.non_terminals.size());

#define ACTION(i, j) table [(i) * terminal_count + (j)]
#define GOTO(i, j) pgoto [(i) * non_terminal_count + (j)]

  int *table = new int [state_count * terminal_count];
  ::memset (table, 0, state_count * terminal_count * sizeof (int));

  int *pgoto = new int [state_count * non_terminal_count];
  ::memset (pgoto, 0, state_count * non_terminal_count * sizeof (int));

  accept_state = -1;
  int shift_reduce_conflict_count = 0;
  int reduce_reduce_conflict_count = 0;

  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state)
    {
      int q = aut.id (state);

      for (Bundle::iterator a = state->bundle.begin (); a != state->bundle.end (); ++a)
        {
          int symbol = aut.id (a.key ());
          int r = aut.id (a.value ());

          Q_ASSERT (r < state_count);

          if (grammar.isNonTerminal (a.key ()))
            {
              Q_ASSERT(symbol >= terminal_count && symbol < static_cast<int>(grammar.names.size()));
              GOTO (q, symbol - terminal_count) = r;
            }

          else
            ACTION (q, symbol) = r;
        }

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int r = aut.id (item->rule);

          const NameSet lookaheads = aut.lookaheads.value (item);

          if (item->rule == grammar.goal)
            accept_state = q;

          for (const Name &s : lookaheads)
            {
              int &u = ACTION (q, aut.id (s));

              if (u == 0)
                u = - r;

              else if (u < 0)
                {
                  if (verbose)
                    qout() << "*** Warning. Found a reduce/reduce conflict in state " << q << " on token ``" << s << "'' between rule "
                         << r << " and " << -u << Qt::endl;

                  ++reduce_reduce_conflict_count;

                  u = qMax (u, -r);

                  if (verbose)
                    qout() << "\tresolved using rule " << -u << Qt::endl;
                }

              else if (u > 0)
                {
                  if (item->rule->prec != grammar.names.end() && grammar.token_info.contains (s))
                    {
                      Grammar::TokenInfo info_r = grammar.token_info.value (item->rule->prec);
                      Grammar::TokenInfo info_s = grammar.token_info.value (s);

                      if (info_r.prec > info_s.prec)
                        u = -r;
                      else if (info_r.prec == info_s.prec)
                        {
                          switch (info_r.assoc) {
                          case Grammar::Left:
                            u = -r;
                            break;
                          case Grammar::Right:
                            // shift... nothing to do
                            break;
                          case Grammar::NonAssoc:
                            u = 0;
                            break;
                          } // switch
                        }
                    }

                  else
                    {
                      ++shift_reduce_conflict_count;

                      if (verbose)
                        qout() << "*** Warning. Found a shift/reduce conflict in state " << q << " on token ``" << s << "'' with rule " << r << Qt::endl;
                    }
                }
            }
        }
    }

  if (shift_reduce_conflict_count || reduce_reduce_conflict_count)
    {
      if (shift_reduce_conflict_count != grammar.expected_shift_reduce
          || reduce_reduce_conflict_count != grammar.expected_reduce_reduce)
        {
          qerr() << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl;
          if (warnings_are_errors)
            {
              qerr() << "qlalr: error: warning occurred, treating as error due to "
                        "--exit-on-warn." << Qt::endl;
              exit(2);
            }
        }

      if (verbose)
        qout() << Qt::endl << "*** Conflicts: " << shift_reduce_conflict_count << " shift/reduce, " << reduce_reduce_conflict_count << " reduce/reduce" << Qt::endl
             << Qt::endl;
    }

  QBitArray used_rules{static_cast<int>(grammar.rules.size())};

  int q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u < 0)
            used_rules.setBit (-u - 1);
        }
    }

  auto rule = grammar.rules.begin();
  for (int i = 0; i < used_rules.size(); ++i, ++rule)
    {
      if (! used_rules.testBit (i))
        {
          if (rule != grammar.goal)
            {
              qerr() << "*** Warning: Rule ``" << *rule << "'' is useless!" << Qt::endl;
              if (warnings_are_errors)
                {
                  qerr() << "qlalr: error: warning occurred, treating as error due to "
                            "--exit-on-warn." << Qt::endl;
                  exit(2);
                }
            }
        }
    }

  q = 0;
  for (StatePointer state = aut.states.begin (); state != aut.states.end (); ++state, ++q)
    {
      for (int j = 0; j < terminal_count; ++j)
        {
          int &u = ACTION (q, j);

          if (u >= 0)
            continue;

          RulePointer rule = std::next(grammar.rules.begin(), - u - 1);

          if (state->defaultReduce == rule)
            u = 0;
        }
    }

  // ... compress the goto table
  defgoto.resize (non_terminal_count);
  for (int j = 0; j < non_terminal_count; ++j)
    {
      count.fill (0, state_count);

      int &mx = defgoto [j];

      for (int i = 0; i < state_count; ++i)
        {
          int r = GOTO (i, j);

          if (! r)
            continue;

          ++count [r];

          if (count [r] > count [mx])
            mx = r;
        }
    }

  for (int i = 0; i < state_count; ++i)
    {
      for (int j = 0; j < non_terminal_count; ++j)
        {
          int &r = GOTO (i, j);

          if (r == defgoto [j])
            r = 0;
        }
    }

  compressed_action (table, state_count, terminal_count);
  compressed_goto (pgoto, state_count, non_terminal_count);

  delete[] table;
  table = nullptr;

  delete[] pgoto;
  pgoto = nullptr;

#undef ACTION
#undef GOTO

  if (! grammar.merged_output.isEmpty())
    {
      QFile f(grammar.merged_output);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s\n", qPrintable(grammar.merged_output));
          return;
        }

      QTextStream out (&f);

      // copyright headers must come first, otherwise the headers tests will fail
      if (copyright)
        {
          out << copyrightHeader()
              << privateCopyrightHeader()
              << Qt::endl;
        }

      out << "// This file was generated by qlalr - DO NOT EDIT!\n";

      out << startIncludeGuard(grammar.merged_output) << Qt::endl;

      if (copyright) {
          out << "#if defined(ERROR)" << Qt::endl
              << "#  undef ERROR" << Qt::endl
              << "#endif" << Qt::endl << Qt::endl;
      }

      generateDecl (out);
      generateImpl (out);
      out << p.decls();
      out << p.impls();
      out << Qt::endl;

      out << endIncludeGuard(grammar.merged_output) << Qt::endl;

      return;
    }

  // default behaviour
  QString declFileName = grammar.table_name.toLower () + "_p.h"_L1;
  QString bitsFileName = grammar.table_name.toLower () + ".cpp"_L1;

  { // decls...
    QFile f (declFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(declFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    QString prot = declFileName.toUpper ().replace (QLatin1Char ('.'), QLatin1Char ('_'));

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      {
        out << copyrightHeader()
            << privateCopyrightHeader()
            << Qt::endl;
      }

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#ifndef " << prot << Qt::endl
        << "#define " << prot << Qt::endl
        << Qt::endl;

    if (copyright) {
        out << "#include <QtCore/qglobal.h>" << Qt::endl << Qt::endl;
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    }
    generateDecl (out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

    out << "#endif // " << prot << Qt::endl << Qt::endl;
  } // end decls

  { // bits...
    QFile f (bitsFileName);
    if (! f.open (QFile::WriteOnly))
      {
        fprintf (stderr, "*** cannot create %s: %s\n",
                 qPrintable(bitsFileName), qPrintable(f.errorString()));
        return;
      }
    QTextStream out (&f);

    // copyright headers must come first, otherwise the headers tests will fail
    if (copyright)
      out << copyrightHeader();

    out << "// This file was generated by qlalr - DO NOT EDIT!\n";

    out << "#include \"" << declFileName << "\"" << Qt::endl << Qt::endl;
    if (copyright)
        out << "QT_BEGIN_NAMESPACE" << Qt::endl << Qt::endl;
    generateImpl(out);
    if (copyright)
        out << "QT_END_NAMESPACE" << Qt::endl;

  } // end bits

  if (! grammar.decl_file_name.isEmpty ())
    {
      QFile f (grammar.decl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.decl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.decls();
    }

  if (! grammar.impl_file_name.isEmpty ())
    {
      QFile f (grammar.impl_file_name);
      if (! f.open (QFile::WriteOnly))
        {
          fprintf (stderr, "*** cannot create %s: %s\n",
                   qPrintable(grammar.impl_file_name), qPrintable(f.errorString()));
          return;
        }
      QTextStream out (&f);
      out << p.impls();
    }
}